

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O2

int __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>::
remove(HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
       *this,char *__filename)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_> *pNVar2
  ;
  long extraout_RDX;
  long lVar3;
  char *pcVar4;
  pair<unsigned_long,_short> pVar5;
  
  lVar3 = (long)(this->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = (char *)(lVar3 >> 4);
  do {
    pcVar4 = pcVar4 + -1;
    if (pcVar4 == (char *)0xffffffffffffffff) {
      _throwValueErrorNotFound(this,(pair<unsigned_long,_short> *)__filename);
      if ((short)this->_count <= *(short *)(extraout_RDX + 8)) {
        lVar3 = (long)__filename << 4;
        for (pcVar4 = __filename; pcVar4 != (char *)0xffffffffffffffff; pcVar4 = pcVar4 + -1) {
          pNVar2 = *(Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                     **)((long)&((this->_nodeRefs)._nodes.
                                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pNode + lVar3);
          if (pNVar2 != (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                         *)0x0) {
            iVar1 = Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                    ::remove(pNVar2,pcVar4);
            if ((Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                 *)CONCAT44(extraout_var_00,iVar1) !=
                (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                 *)0x0) {
              pNVar2 = Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                       ::_adjRemoveRefs((Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                                         *)this,(size_t)pcVar4,
                                        (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                                         *)CONCAT44(extraout_var_00,iVar1));
              return (int)pNVar2;
            }
          }
          lVar3 = lVar3 + -0x10;
        }
      }
      if ((__filename == (char *)0x0) && ((short)this->_count == *(short *)(extraout_RDX + 8))) {
        (this->_nodeRefs)._swapLevel = 0;
      }
      else {
        this = (HeadNode<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                *)0x0;
      }
      return (int)this;
    }
    iVar1 = Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
            ::remove(*(Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                       **)((long)&(this->_nodeRefs)._nodes.
                                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].pNode + lVar3),
                     pcVar4);
    pNVar2 = (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
              *)CONCAT44(extraout_var,iVar1);
    lVar3 = lVar3 + -0x10;
  } while (pNVar2 == (Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
                      *)0x0);
  _adjRemoveRefs(this,(pNVar2->_nodeRefs)._swapLevel,pNVar2);
  this->_count = this->_count - 1;
  pVar5 = Node<std::pair<unsigned_long,_short>,_duckdb::SkipLess<std::pair<unsigned_long,_short>_>_>
          ::_Pool::Release(&this->_pool,pNVar2);
  return (int)pVar5.first;
}

Assistant:

T HeadNode<T, _Compare>::remove(const T &value) {
#ifdef SKIPLIST_THREAD_SUPPORT
    std::lock_guard<std::mutex> lock(gSkipListMutex);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode remove() thread: " << std::this_thread::get_id() << std::endl;
#endif
#endif
    Node<T, _Compare> *pNode = nullptr;
    size_t level;

    _throwIfValueDoesNotCompare(value);
    for (level = _nodeRefs.height(); level-- > 0;) {
        assert(_nodeRefs[level].pNode);
        pNode = _nodeRefs[level].pNode->remove(level, value);
        if (pNode) {
            break;
        }
    }
    if (! pNode) {
        _throwValueErrorNotFound(value);
    }
    // Take swap level as some swaps will have been dealt with by the remove() above.
    _adjRemoveRefs(pNode->nodeRefs().swapLevel(), pNode);
    --_count;
    T ret_val = _pool.Release(pNode);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode remove() thread: " << std::this_thread::get_id() << " DONE" << std::endl;
#endif
    return ret_val;
}